

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

string * __thiscall
pbrt::ThinDielectricMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ThinDielectricMaterial *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&>
            (__return_storage_ptr__,"[ ThinDielectricMaterial displacement: %s etaF: %s etaS: %s ]",
             &this->displacement,&this->etaF,&this->etaS);
  return __return_storage_ptr__;
}

Assistant:

std::string ThinDielectricMaterial::ToString() const {
    return StringPrintf("[ ThinDielectricMaterial displacement: %s etaF: %s etaS: %s ]",
                        displacement, etaF, etaS);
}